

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3
          (LASreadItemCompressed_BYTE14_v3 *this,ArithmeticDecoder *dec,U32 number,
          U32 decompress_selective)

{
  U32 *pUVar1;
  BOOL *pBVar2;
  BOOL *pBVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015fb50;
  if (dec == (ArithmeticDecoder *)0x0) {
    __assert_fail("dec",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                  ,0x83e,
                  "LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder *, U32, const U32)"
                 );
  }
  this->dec = dec;
  if (number != 0) {
    this->number = number;
    uVar6 = (ulong)number;
    this->instream_Bytes = (ByteStreamInArray **)0x0;
    this->dec_Bytes = (ArithmeticDecoder **)0x0;
    pUVar1 = (U32 *)operator_new__(uVar6 * 4);
    this->num_bytes_Bytes = pUVar1;
    pBVar2 = (BOOL *)operator_new__(uVar6);
    this->changed_Bytes = pBVar2;
    pBVar3 = (BOOL *)operator_new__(uVar6);
    this->requested_Bytes = pBVar3;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      pUVar1[uVar5] = 0;
      pBVar2[uVar5] = false;
      pBVar3[uVar5] = (0x10000 << ((byte)uVar5 & 0x1f) & decompress_selective) != 0 || 0xf < uVar5;
    }
    this->bytes = (U8 *)0x0;
    this->num_bytes_allocated = 0;
    for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x18) {
      *(undefined8 *)((long)&this->contexts[0].m_bytes + lVar4) = 0;
    }
    this->current_context = 0;
    return;
  }
  __assert_fail("number",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                ,0x843,
                "LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder *, U32, const U32)"
               );
}

Assistant:

LASreadItemCompressed_BYTE14_v3::LASreadItemCompressed_BYTE14_v3(ArithmeticDecoder* dec, U32 number, const U32 decompress_selective)
{
  /* not used as a decoder. just gives access to instream */

  assert(dec);
  this->dec = dec;

  /* must be more than one byte */

  assert(number);
  this->number = number;

  /* zero instream and decoder pointer arrays */

  instream_Bytes = 0;

  dec_Bytes = 0;

  /* create and init num_bytes and booleans arrays */

  num_bytes_Bytes = new U32[number];

  changed_Bytes = new BOOL[number];

  requested_Bytes = new BOOL[number];

  U32 i;
  for (i = 0; i < number; i++)
  {
    num_bytes_Bytes[i] = 0;

    changed_Bytes[i] = FALSE;

    if (i > 15) // currently only the first 16 extra bytes can be selectively decompressed
    {
      requested_Bytes[i] = TRUE;
    }
    else
    {
      requested_Bytes[i] = (decompress_selective & (LASZIP_DECOMPRESS_SELECTIVE_BYTE0 << i) ? TRUE : FALSE);
    }
  }

  /* init the bytes buffer to zero */

  bytes = 0;
  num_bytes_allocated = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_bytes = 0;
  }
  current_context = 0;
}